

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O0

MPP_RET hal_vp9d_prob_default(void *buf,void *dxva)

{
  bool local_a1;
  int local_a0;
  int local_9c;
  RK_S32 byte_count_1;
  RK_S32 byte_count;
  vp9_prob partition_probs [16] [3];
  RK_S32 intraFlag;
  DXVA_PicParams_VP9 *pic_param;
  BitputCtx_t bp;
  RK_U64 *probe_packet;
  RK_S32 fifo_len;
  RK_S32 n;
  RK_S32 m;
  RK_S32 k;
  RK_S32 j;
  RK_S32 i;
  void *dxva_local;
  void *buf_local;
  
  bp.bitpos = '\0';
  bp._25_3_ = 0;
  bp.size = 0;
  local_a1 = true;
  if ((*(ushort *)((long)dxva + 2) & 1) != 0) {
    local_a1 = (*(ushort *)((long)dxva + 2) >> 7 & 1) != 0;
  }
  partition_probs._44_4_ = ZEXT14(local_a1);
  memset(buf,0,0x1300);
  if (partition_probs._44_4_ != 0) {
    *(undefined4 *)((long)dxva + 0x183) = 0x5258803;
    *(undefined2 *)((long)dxva + 0x187) = 0xd34;
    *(undefined4 *)((long)dxva + 0x189) = 0x650f9814;
    *(undefined2 *)((long)dxva + 0x18d) = 0x4264;
    *(undefined2 *)((long)dxva + 399) = 0x80c0;
    *(undefined1 *)((long)dxva + 0x191) = 0x40;
    memcpy((void *)((long)dxva + 0x207),vp9_default_coef_probs,0x6c0);
  }
  memcpy(&byte_count_1,(void *)((long)dxva + 0x1d7),0x30);
  bp._24_8_ = mpp_osal_calloc("hal_vp9d_prob_default",0x1300);
  memset((void *)bp._24_8_,0,0x260);
  mpp_set_bitput_ctx((BitputCtx_t *)&pic_param,(RK_U64 *)bp._24_8_,0x260);
  for (k = 0; k < 0x10; k = k + 1) {
    for (m = 0; m < 3; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)&byte_count_1 + (long)m + (long)k * 3),8);
    }
  }
  for (k = 0; k < 3; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,0,8);
  }
  for (k = 0; k < 7; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,0,8);
  }
  for (k = 0; k < 3; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 399),8);
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 3; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 3 + 0x183),8);
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 2 + 0x189),8);
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 0x18d),8);
  }
  for (k = 0; k < 4; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 0x16b),8);
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (k = 0; k < 4; k = k + 1) {
    for (m = 0; m < 9; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 9 + 0xd0),8);
    }
  }
  for (k = 0; k < 5; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 0x16f),8);
  }
  for (k = 0; k < 5; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 0x17e),8);
  }
  for (k = 0; k < 5; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 2 + 0x174),8);
    }
  }
  for (k = 0; k < 7; k = k + 1) {
    for (m = 0; m < 3; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 3 + 0x156),8);
    }
  }
  for (k = 0; k < 4; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 2 + 0x14e),8);
    }
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (k = 0; k < 4; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      local_9c = 0;
      for (n = 0; n < 6; n = n + 1) {
        for (fifo_len = 0; fifo_len < 6; fifo_len = fifo_len + 1) {
          for (probe_packet._4_4_ = 0; probe_packet._4_4_ < 3;
              probe_packet._4_4_ = probe_packet._4_4_ + 1) {
            mpp_put_bits((BitputCtx_t *)&pic_param,
                         (ulong)*(byte *)((long)dxva +
                                         (long)probe_packet._4_4_ +
                                         (long)fifo_len * 3 +
                                         (long)n * 0x12 + (long)m * 0xd8 + (long)k * 0x1b0 + 0x207),
                         8);
            local_9c = local_9c + 1;
            if (local_9c == 0x1b) {
              mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
              local_9c = 0;
            }
          }
        }
      }
      mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
    }
  }
  for (k = 0; k < 4; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      local_a0 = 0;
      for (n = 0; n < 6; n = n + 1) {
        for (fifo_len = 0; fifo_len < 6; fifo_len = fifo_len + 1) {
          for (probe_packet._4_4_ = 0; probe_packet._4_4_ < 3;
              probe_packet._4_4_ = probe_packet._4_4_ + 1) {
            mpp_put_bits((BitputCtx_t *)&pic_param,
                         (ulong)*(byte *)((long)dxva +
                                         (long)probe_packet._4_4_ +
                                         (long)fifo_len * 3 +
                                         (long)n * 0x12 + (long)m * 0xd8 + (long)k * 0x1b0 + 0x273),
                         8);
            local_a0 = local_a0 + 1;
            if (local_a0 == 0x1b) {
              mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
              local_a0 = 0;
            }
          }
        }
      }
      mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
    }
  }
  for (k = 0; k < 3; k = k + 1) {
    for (m = 0; m < 9; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 9 + 0xf4),8);
    }
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (; k < 6; k = k + 1) {
    for (m = 0; m < 9; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 9 + 0xf4),8);
    }
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (; k < 9; k = k + 1) {
    for (m = 0; m < 9; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 9 + 0xf4),8);
    }
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (; k < 10; k = k + 1) {
    for (m = 0; m < 9; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 9 + 0xf4),8);
    }
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  mpp_put_bits((BitputCtx_t *)&pic_param,0,8);
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  for (k = 0; k < 3; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k + 0x192),8);
  }
  for (k = 0; k < 2; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k * 0x21 + 0x195),8);
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 10; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 0x21 + 0x196),8);
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k * 0x21 + 0x1a0),8);
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 10; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 0x21 + 0x1a1),8);
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 2; m = m + 1) {
      for (n = 0; n < 3; n = n + 1) {
        mpp_put_bits((BitputCtx_t *)&pic_param,
                     (ulong)*(byte *)((long)dxva + (long)n + (long)m * 3 + (long)k * 0x21 + 0x1ab),8
                    );
      }
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    for (m = 0; m < 3; m = m + 1) {
      mpp_put_bits((BitputCtx_t *)&pic_param,
                   (ulong)*(byte *)((long)dxva + (long)m + (long)k * 0x21 + 0x1b1),8);
    }
  }
  for (k = 0; k < 2; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k * 0x21 + 0x1b4),8);
  }
  for (k = 0; k < 2; k = k + 1) {
    mpp_put_bits((BitputCtx_t *)&pic_param,(ulong)*(byte *)((long)dxva + (long)k * 0x21 + 0x1b5),8);
  }
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  mpp_put_bits((BitputCtx_t *)&pic_param,0,8);
  mpp_put_align((BitputCtx_t *)&pic_param,0x80,0);
  memcpy(buf,(void *)bp._24_8_,0x1300);
  if (bp._24_8_ != 0) {
    mpp_osal_free("hal_vp9d_prob_default",(void *)bp._24_8_);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_prob_default(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = PROB_SIZE >> 3;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    memset(buf, 0, PROB_SIZE);

    if (intraFlag) {
        memcpy(&pic_param->prob.tx32p, &vp9_default_probs.tx32p, sizeof(vp9_default_probs.tx32p));
        memcpy(&pic_param->prob.tx16p, &vp9_default_probs.tx16p, sizeof(vp9_default_probs.tx16p));
        memcpy(&pic_param->prob.tx8p,  &vp9_default_probs.tx8p, sizeof(vp9_default_probs.tx8p));
        memcpy(&pic_param->prob.skip,  &vp9_default_probs.skip, sizeof(vp9_default_probs.skip));
        memcpy(&pic_param->prob.coef,  &vp9_default_coef_probs, sizeof(vp9_default_coef_probs));
    }
    memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));

    probe_packet = mpp_calloc(RK_U64, fifo_len);
    memset(probe_packet, 0, fifo_len);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);

    //sb info  5 x 128 bit
    for (i = 0; i < 16; i++) //kf_partition_prob
        for (j = 0; j < 3; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, 0, 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, 0, 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);

    //intra_y_mode & inter_block info   6 x 128 bit
    for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

    for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
        mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
        mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

    for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
        for (j = 0; j < 2; j++)
            mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

    for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
        for (j = 0; j < INTER_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


    for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
        for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

    mpp_put_align(&bp, 128, 0);

    //128 x 128bit
    //coeff releated
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++)
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }
            }
            mpp_put_align(&bp, 128, 0);
        }
    for (i = 0; i < TX_SIZES; i++)
        for (j = 0; j < PLANE_TYPES; j++) {
            RK_S32 byte_count = 0;
            for (k = 0; k < COEF_BANDS; k++) {
                for (m = 0; m < COEFF_CONTEXTS; m++) {
                    for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                        mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                        byte_count++;
                        if (byte_count == 27) {
                            mpp_put_align(&bp, 128, 0);
                            byte_count = 0;
                        }
                    }

                }
            }
            mpp_put_align(&bp, 128, 0);
        }

    //intra uv mode 6 x 128
    for (i = 0; i < 3; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 6; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);

    for (; i < 9; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);
    mpp_put_align(&bp, 128, 0);
    for (; i < INTRA_MODES; i++) //intra_uv_mode
        for (j = 0; j < INTRA_MODES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.uv_mode[i][j], 8);

    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    //mv releated 6 x 128
    for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
        mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

    for (i = 0; i < 2; i++) { //sign bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
    }
    for (i = 0; i < 2; i++) { //classes bit
        for (j = 0; j < MV_CLASSES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
    }
    for (i = 0; i < 2; i++) { //classe0 bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
    }
    for (i = 0; i < 2; i++) { // bits
        for (j = 0; j < MV_OFFSET_BITS; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_fp bit
        for (j = 0; j < CLASS0_SIZE; j++)
            for (k = 0; k < MV_FP_SIZE - 1; k++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
    }
    for (i = 0; i < 2; i++) { //comp ref bit
        for (j = 0; j < MV_FP_SIZE - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
    }
    for (i = 0; i < 2; i++) { //class0_hp bit

        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
    }
    for (i = 0; i < 2; i++) { //hp bit
        mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
    }
    mpp_put_align(&bp, 128, 0);
    mpp_put_bits(&bp, 0, 8);
    mpp_put_align(&bp, 128, 0);

    memcpy(buf, probe_packet, fifo_len << 3);

#if VP9_DUMP
    {
        static RK_U32 file_cnt = 0;
        char file_name[128];
        sprintf(file_name, "/data/vp9/prob_default_%d.txt", file_cnt);
        FILE *vp9_fp = fopen(file_name, "wb");
        RK_U32 *tmp = (RK_U32 *)buf;
        for (i = 0; i < bp.index * 2; i += 2) {
            fprintf(vp9_fp, "%08x%08x\n", tmp[i + 1], tmp[i]);
        }
        file_cnt++;
        fflush(vp9_fp);
        fclose(vp9_fp);
    }
#endif
    MPP_FREE(probe_packet);

    return 0;
}